

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmConfigureLog.cxx
# Opt level: O1

void __thiscall cmConfigureLog::WriteValue(cmConfigureLog *this,string_view key,string *value)

{
  StreamWriter *pSVar1;
  ostream *poVar2;
  uint uVar3;
  Value local_58;
  
  if (this->Indent != 0) {
    uVar3 = 0;
    do {
      std::__ostream_insert<char,std::char_traits<char>>
                (&(this->Stream).super_basic_ostream<char,_std::char_traits<char>_>,"  ",2);
      uVar3 = uVar3 + 1;
    } while (uVar3 < this->Indent);
  }
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     (&(this->Stream).super_basic_ostream<char,_std::char_traits<char>_>,key._M_str,
                      key._M_len);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,": ",2);
  pSVar1 = (this->Encoder)._M_t.
           super___uniq_ptr_impl<Json::StreamWriter,_std::default_delete<Json::StreamWriter>_>._M_t.
           super__Tuple_impl<0UL,_Json::StreamWriter_*,_std::default_delete<Json::StreamWriter>_>.
           super__Head_base<0UL,_Json::StreamWriter_*,_false>._M_head_impl;
  Json::Value::Value(&local_58,value);
  (*pSVar1->_vptr_StreamWriter[2])(pSVar1,&local_58,&this->Stream);
  Json::Value::~Value(&local_58);
  EndLine(this);
  return;
}

Assistant:

void cmConfigureLog::WriteValue(cm::string_view key, std::string const& value)
{
  this->BeginLine() << key << ": ";
  this->Encoder->write(value, &this->Stream);
  this->EndLine();
}